

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

void __thiscall cmake::AddDefaultExtraGenerators(cmake *this)

{
  RegisteredExtraGeneratorsVector *this_00;
  cmExternalMakefileProjectGeneratorFactory *local_18;
  
  this_00 = &this->ExtraGenerators;
  local_18 = cmExtraCodeBlocksGenerator::GetFactory();
  std::
  vector<cmExternalMakefileProjectGeneratorFactory*,std::allocator<cmExternalMakefileProjectGeneratorFactory*>>
  ::emplace_back<cmExternalMakefileProjectGeneratorFactory*>
            ((vector<cmExternalMakefileProjectGeneratorFactory*,std::allocator<cmExternalMakefileProjectGeneratorFactory*>>
              *)this_00,&local_18);
  local_18 = cmExtraCodeLiteGenerator::GetFactory();
  std::
  vector<cmExternalMakefileProjectGeneratorFactory*,std::allocator<cmExternalMakefileProjectGeneratorFactory*>>
  ::emplace_back<cmExternalMakefileProjectGeneratorFactory*>
            ((vector<cmExternalMakefileProjectGeneratorFactory*,std::allocator<cmExternalMakefileProjectGeneratorFactory*>>
              *)this_00,&local_18);
  local_18 = cmExtraSublimeTextGenerator::GetFactory();
  std::
  vector<cmExternalMakefileProjectGeneratorFactory*,std::allocator<cmExternalMakefileProjectGeneratorFactory*>>
  ::emplace_back<cmExternalMakefileProjectGeneratorFactory*>
            ((vector<cmExternalMakefileProjectGeneratorFactory*,std::allocator<cmExternalMakefileProjectGeneratorFactory*>>
              *)this_00,&local_18);
  local_18 = cmExtraKateGenerator::GetFactory();
  std::
  vector<cmExternalMakefileProjectGeneratorFactory*,std::allocator<cmExternalMakefileProjectGeneratorFactory*>>
  ::emplace_back<cmExternalMakefileProjectGeneratorFactory*>
            ((vector<cmExternalMakefileProjectGeneratorFactory*,std::allocator<cmExternalMakefileProjectGeneratorFactory*>>
              *)this_00,&local_18);
  local_18 = cmExtraEclipseCDT4Generator::GetFactory();
  std::
  vector<cmExternalMakefileProjectGeneratorFactory*,std::allocator<cmExternalMakefileProjectGeneratorFactory*>>
  ::emplace_back<cmExternalMakefileProjectGeneratorFactory*>
            ((vector<cmExternalMakefileProjectGeneratorFactory*,std::allocator<cmExternalMakefileProjectGeneratorFactory*>>
              *)this_00,&local_18);
  return;
}

Assistant:

void cmake::AddDefaultExtraGenerators()
{
#if defined(CMAKE_BUILD_WITH_CMAKE)
  this->ExtraGenerators.push_back(cmExtraCodeBlocksGenerator::GetFactory());
  this->ExtraGenerators.push_back(cmExtraCodeLiteGenerator::GetFactory());
  this->ExtraGenerators.push_back(cmExtraSublimeTextGenerator::GetFactory());
  this->ExtraGenerators.push_back(cmExtraKateGenerator::GetFactory());

#  ifdef CMAKE_USE_ECLIPSE
  this->ExtraGenerators.push_back(cmExtraEclipseCDT4Generator::GetFactory());
#  endif

#endif
}